

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_prediction_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_7284ee::
DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
::RunTest(DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
          *this,bool speedtest,bool needsaturation,int p_angle)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  long *plVar4;
  __suseconds_t _Var5;
  uint32_t uVar6;
  long lVar7;
  int iVar8;
  unsigned_short *puVar9;
  long lVar10;
  undefined7 in_register_00000011;
  long lVar11;
  pointer *__ptr;
  int iVar12;
  pointer puVar13;
  undefined7 in_register_00000031;
  ulong uVar14;
  SEARCH_METHODS *message;
  int i;
  int iVar15;
  long lVar16;
  uint16_t in_FPUControlWord;
  uint16_t in_FPUStatusWord;
  uint16_t in_FPULastInstructionOpcode;
  undefined8 in_FPUInstructionPointer;
  uint uVar17;
  undefined4 uVar18;
  uint uVar21;
  ulong uVar19;
  undefined1 auVar20 [16];
  RegisterStateCheckMMX local_378;
  unsigned_short *local_358;
  int local_34c;
  aom_usec_timer timer;
  AssertHelper local_320;
  uint local_318;
  int local_314;
  vector<unsigned_short,_std::allocator<unsigned_short>_> dst_tst;
  vector<unsigned_short,_std::allocator<unsigned_short>_> dst_ref;
  unsigned_short above_data [160];
  unsigned_short left_data [160];
  
  uVar14 = CONCAT71(in_register_00000011,needsaturation);
  this->bd_ = (this->params_).bit_depth;
  uVar17 = p_angle - 0x5a;
  uVar21 = p_angle - 0xb4;
  local_314 = (int)CONCAT71(in_register_00000031,speedtest);
  local_34c = 1;
  if (local_314 != 0) {
    local_34c = 10000;
  }
  lVar10 = 0;
  local_318 = (uint)uVar14;
  do {
    bVar1 = (&(anonymous_namespace)::kTxSize)[lVar10];
    iVar15 = ::tx_size_wide[bVar1];
    this->bw_ = iVar15;
    iVar12 = ::tx_size_high[bVar1];
    this->bh_ = iVar12;
    if (this->enable_upsample_ == 0) {
      this->upsample_above_ = 0;
      this->upsample_left_ = 0;
    }
    else {
      bVar3 = iVar12 + iVar15 < 0x11;
      uVar19 = (ulong)CONCAT14(bVar3,(uint)bVar3) &
               (CONCAT44(-(uint)(-0x7fffffd9 <
                                 (int)((uVar21 ^ (int)uVar21 >> 0x1f) - ((int)uVar21 >> 0x1f) ^
                                      0x80000000) || uVar21 == 0),
                         -(uint)(-0x7fffffd9 <
                                 (int)((uVar17 ^ (int)uVar17 >> 0x1f) - ((int)uVar17 >> 0x1f) ^
                                      0x80000000) || uVar17 == 0)) ^ 0xffffffffffffffff) &
               (ulong)DAT_00c4dc40;
      this->upsample_above_ = (int)uVar19;
      this->upsample_left_ = (int)(uVar19 >> 0x20);
    }
    if ((char)uVar14 == '\0') {
      lVar7 = 0;
      do {
        uVar6 = testing::internal::Random::Generate(&(this->rng_).random_,0x80000000);
        left_data[lVar7] = (ushort)(uVar6 >> 0x17) & 0xff;
        uVar6 = testing::internal::Random::Generate(&(this->rng_).random_,0x80000000);
        above_data[lVar7] = (ushort)(uVar6 >> 0x17) & 0xff;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0xa0);
    }
    else {
      auVar20 = ZEXT416((uint)~(-1 << ((byte)this->bd_ & 0x1f)));
      auVar20 = pshuflw(auVar20,auVar20,0);
      uVar18 = auVar20._0_4_;
      lVar7 = 0;
      do {
        *(undefined4 *)(left_data + lVar7) = uVar18;
        *(undefined4 *)(left_data + lVar7 + 2) = uVar18;
        *(undefined4 *)(left_data + lVar7 + 4) = uVar18;
        *(undefined4 *)(left_data + lVar7 + 6) = uVar18;
        *(undefined4 *)(above_data + lVar7) = uVar18;
        *(undefined4 *)(above_data + lVar7 + 2) = uVar18;
        *(undefined4 *)(above_data + lVar7 + 4) = uVar18;
        *(undefined4 *)(above_data + lVar7 + 6) = uVar18;
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0xa0);
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&dst_ref,(long)this->bh_ * 0x50,(allocator_type *)&timer);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&dst_tst,(long)this->bh_ * 0x50,(allocator_type *)&timer);
    puVar13 = dst_ref.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_358 = dst_tst.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start;
    this->bd_ = (this->params_).bit_depth;
    gettimeofday((timeval *)&timer,(__timezone_ptr_t)0x0);
    iVar15 = local_34c;
    do {
      (*(this->params_).ref_fn)
                (puVar13,0x50,this->bw_,this->bh_,above_data + 0x10,left_data + 0x10,
                 this->upsample_above_,this->upsample_left_,this->dx_,this->dy_,this->bd_);
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    gettimeofday((timeval *)&timer.end,(__timezone_ptr_t)0x0);
    lVar16 = timer.end.tv_usec - timer.begin.tv_usec;
    iVar15 = (int)timer.end.tv_sec - (int)timer.begin.tv_sec;
    lVar7 = lVar16 + 1000000;
    if (-1 < lVar16) {
      lVar7 = lVar16;
    }
    if ((this->params_).tst_fn ==
        (_func_void_unsigned_short_ptr_long_int_int_unsigned_short_ptr_unsigned_short_ptr_int_int_int_int_int
         *)0x0) {
      iVar12 = this->bh_;
      iVar8 = 0;
      if (0 < (long)iVar12) {
        uVar2 = this->bw_;
        lVar11 = 0;
        puVar9 = local_358;
        do {
          if (0 < (int)uVar2) {
            uVar14 = 0;
            do {
              puVar9[uVar14] = puVar13[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar2 != uVar14);
          }
          lVar11 = lVar11 + 1;
          puVar9 = puVar9 + 0x50;
          puVar13 = puVar13 + 0x50;
        } while (lVar11 != iVar12);
      }
    }
    else {
      gettimeofday((timeval *)&timer,(__timezone_ptr_t)0x0);
      iVar12 = local_34c;
      do {
        local_378.pre_fpu_env_._12_6_ = SUB86(in_FPUInstructionPointer,0);
        local_378.pre_fpu_env_[9] = in_FPULastInstructionOpcode;
        local_378.pre_fpu_env_[0] = in_FPUControlWord;
        local_378.pre_fpu_env_[2] = in_FPUStatusWord;
        (*(this->params_).tst_fn)
                  (local_358,0x50,this->bw_,this->bh_,above_data + 0x10,left_data + 0x10,
                   this->upsample_above_,this->upsample_left_,this->dx_,this->dy_,this->bd_);
        libaom_test::RegisterStateCheckMMX::Check(&local_378);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      gettimeofday((timeval *)&timer.end,(__timezone_ptr_t)0x0);
      lVar11 = timer.end.tv_usec - timer.begin.tv_usec;
      iVar8 = (int)lVar11 + 1000000;
      if (-1 < lVar11) {
        iVar8 = (int)lVar11;
      }
      iVar8 = iVar8 + ((int)(lVar11 >> 0x3f) + ((int)timer.end.tv_sec - (int)timer.begin.tv_sec)) *
                      1000000;
    }
    if ((char)local_314 != '\0') {
      if ((this->params_).tst_fn ==
          (_func_void_unsigned_short_ptr_long_int_int_unsigned_short_ptr_unsigned_short_ptr_int_int_int_int_int
           *)0x0) {
        printf("\t[%8s] :: ref time %6d\n",
               *(undefined8 *)((anonymous_namespace)::kTxSizeStrings + lVar10 * 8));
      }
      else {
        printf("\t[%8s] :: ref time %6d, tst time %6d     %3.2f\n",
               (double)((float)((iVar15 + (int)(lVar16 >> 0x3f)) * 1000000 + (int)lVar7) /
                       (float)iVar8),
               *(undefined8 *)((anonymous_namespace)::kTxSizeStrings + lVar10 * 8));
      }
    }
    if (0 < this->bh_) {
      lVar7 = 0;
      puVar9 = (unsigned_short *)0x0;
      do {
        local_358 = puVar9;
        if (0 < this->bw_) {
          lVar11 = 0;
          lVar16 = lVar7;
          do {
            testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
                      ((internal *)&timer,"dst_ref[r * dst_stride + c]",
                       "dst_tst[r * dst_stride + c]",
                       (unsigned_short *)
                       ((long)dst_ref.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar16),
                       (unsigned_short *)
                       ((long)dst_tst.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar16));
            _Var5 = timer.begin.tv_usec;
            if ((char)timer.begin.tv_sec == '\0') {
              testing::Message::Message((Message *)&local_378);
              std::ostream::operator<<
                        ((void *)(CONCAT26(local_378.pre_fpu_env_[3],
                                           CONCAT24(local_378.pre_fpu_env_[2],
                                                    CONCAT22(local_378.pre_fpu_env_[1],
                                                             local_378.pre_fpu_env_[0]))) + 0x10),
                         this->bw_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         (CONCAT26(local_378.pre_fpu_env_[3],
                                   CONCAT24(local_378.pre_fpu_env_[2],
                                            CONCAT22(local_378.pre_fpu_env_[1],
                                                     local_378.pre_fpu_env_[0]))) + 0x10),"x",1);
              std::ostream::operator<<
                        ((void *)(CONCAT26(local_378.pre_fpu_env_[3],
                                           CONCAT24(local_378.pre_fpu_env_[2],
                                                    CONCAT22(local_378.pre_fpu_env_[1],
                                                             local_378.pre_fpu_env_[0]))) + 0x10),
                         this->bh_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         (CONCAT26(local_378.pre_fpu_env_[3],
                                   CONCAT24(local_378.pre_fpu_env_[2],
                                            CONCAT22(local_378.pre_fpu_env_[1],
                                                     local_378.pre_fpu_env_[0]))) + 0x10)," r: ",4);
              std::ostream::operator<<
                        ((void *)(CONCAT26(local_378.pre_fpu_env_[3],
                                           CONCAT24(local_378.pre_fpu_env_[2],
                                                    CONCAT22(local_378.pre_fpu_env_[1],
                                                             local_378.pre_fpu_env_[0]))) + 0x10),
                         (int)local_358);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         (CONCAT26(local_378.pre_fpu_env_[3],
                                   CONCAT24(local_378.pre_fpu_env_[2],
                                            CONCAT22(local_378.pre_fpu_env_[1],
                                                     local_378.pre_fpu_env_[0]))) + 0x10)," c: ",4);
              std::ostream::operator<<
                        ((void *)(CONCAT26(local_378.pre_fpu_env_[3],
                                           CONCAT24(local_378.pre_fpu_env_[2],
                                                    CONCAT22(local_378.pre_fpu_env_[1],
                                                             local_378.pre_fpu_env_[0]))) + 0x10),
                         (int)lVar11);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         (CONCAT26(local_378.pre_fpu_env_[3],
                                   CONCAT24(local_378.pre_fpu_env_[2],
                                            CONCAT22(local_378.pre_fpu_env_[1],
                                                     local_378.pre_fpu_env_[0]))) + 0x10)," dx: ",5)
              ;
              std::ostream::operator<<
                        ((void *)(CONCAT26(local_378.pre_fpu_env_[3],
                                           CONCAT24(local_378.pre_fpu_env_[2],
                                                    CONCAT22(local_378.pre_fpu_env_[1],
                                                             local_378.pre_fpu_env_[0]))) + 0x10),
                         this->dx_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         (CONCAT26(local_378.pre_fpu_env_[3],
                                   CONCAT24(local_378.pre_fpu_env_[2],
                                            CONCAT22(local_378.pre_fpu_env_[1],
                                                     local_378.pre_fpu_env_[0]))) + 0x10)," dy: ",5)
              ;
              std::ostream::operator<<
                        ((void *)(CONCAT26(local_378.pre_fpu_env_[3],
                                           CONCAT24(local_378.pre_fpu_env_[2],
                                                    CONCAT22(local_378.pre_fpu_env_[1],
                                                             local_378.pre_fpu_env_[0]))) + 0x10),
                         this->dy_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         (CONCAT26(local_378.pre_fpu_env_[3],
                                   CONCAT24(local_378.pre_fpu_env_[2],
                                            CONCAT22(local_378.pre_fpu_env_[1],
                                                     local_378.pre_fpu_env_[0]))) + 0x10),
                         " upsample_above: ",0x11);
              std::ostream::operator<<
                        ((void *)(CONCAT26(local_378.pre_fpu_env_[3],
                                           CONCAT24(local_378.pre_fpu_env_[2],
                                                    CONCAT22(local_378.pre_fpu_env_[1],
                                                             local_378.pre_fpu_env_[0]))) + 0x10),
                         this->upsample_above_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         (CONCAT26(local_378.pre_fpu_env_[3],
                                   CONCAT24(local_378.pre_fpu_env_[2],
                                            CONCAT22(local_378.pre_fpu_env_[1],
                                                     local_378.pre_fpu_env_[0]))) + 0x10),
                         " upsample_left: ",0x10);
              std::ostream::operator<<
                        ((void *)(CONCAT26(local_378.pre_fpu_env_[3],
                                           CONCAT24(local_378.pre_fpu_env_[2],
                                                    CONCAT22(local_378.pre_fpu_env_[1],
                                                             local_378.pre_fpu_env_[0]))) + 0x10),
                         this->upsample_left_);
              if (timer.begin.tv_usec == 0) {
                message = "";
              }
              else {
                message = *(SEARCH_METHODS **)timer.begin.tv_usec;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_320,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/dr_prediction_test.cc"
                         ,0x10b,(char *)message);
              testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_378);
              testing::internal::AssertHelper::~AssertHelper(&local_320);
              plVar4 = (long *)CONCAT26(local_378.pre_fpu_env_[3],
                                        CONCAT24(local_378.pre_fpu_env_[2],
                                                 CONCAT22(local_378.pre_fpu_env_[1],
                                                          local_378.pre_fpu_env_[0])));
              if (plVar4 != (long *)0x0) {
                (**(code **)(*plVar4 + 8))();
              }
              if (timer.begin.tv_usec != 0) {
                if (*(void **)timer.begin.tv_usec != (void *)(timer.begin.tv_usec + 0x10)) {
                  operator_delete(*(void **)timer.begin.tv_usec);
                }
                operator_delete((void *)timer.begin.tv_usec);
              }
              if (dst_tst.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(dst_tst.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (dst_ref.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
                return;
              }
              operator_delete(dst_ref.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
              return;
            }
            if (timer.begin.tv_usec != 0) {
              if (*(void **)timer.begin.tv_usec != (void *)(timer.begin.tv_usec + 0x10)) {
                operator_delete(*(void **)timer.begin.tv_usec);
              }
              operator_delete((void *)_Var5);
            }
            lVar11 = lVar11 + 1;
            lVar16 = lVar16 + 2;
          } while (lVar11 < this->bw_);
        }
        puVar9 = (unsigned_short *)((long)local_358 + 1);
        lVar7 = lVar7 + 0xa0;
      } while ((long)puVar9 < (long)this->bh_);
    }
    if (dst_tst.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(dst_tst.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (dst_ref.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(dst_ref.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    lVar10 = lVar10 + 1;
    uVar14 = (ulong)local_318;
    if (lVar10 == 0x13) {
      return;
    }
  } while( true );
}

Assistant:

void RunTest(bool speedtest, bool needsaturation, int p_angle) {
    bd_ = params_.bit_depth;

    for (int tx = 0; tx < TX_SIZES_ALL; ++tx) {
      bw_ = tx_size_wide[kTxSize[tx]];
      bh_ = tx_size_high[kTxSize[tx]];

      if (enable_upsample_) {
        upsample_above_ =
            av1_use_intra_edge_upsample(bw_, bh_, p_angle - 90, 0);
        upsample_left_ =
            av1_use_intra_edge_upsample(bw_, bh_, p_angle - 180, 0);
      } else {
        upsample_above_ = upsample_left_ = 0;
      }

      // Declare input buffers as local arrays to allow checking for
      // over-reads.
      DECLARE_ALIGNED(16, Pixel, left_data[kNumIntraNeighbourPixels]);
      DECLARE_ALIGNED(16, Pixel, above_data[kNumIntraNeighbourPixels]);

      // We need to allow reading some previous bytes from the input pointers.
      const Pixel *above = &above_data[kIntraPredInputPadding];
      const Pixel *left = &left_data[kIntraPredInputPadding];

      if (needsaturation) {
        const Pixel sat = (1 << bd_) - 1;
        for (int i = 0; i < kNumIntraNeighbourPixels; ++i) {
          left_data[i] = sat;
          above_data[i] = sat;
        }
      } else {
        for (int i = 0; i < kNumIntraNeighbourPixels; ++i) {
          left_data[i] = rng_.Rand8();
          above_data[i] = rng_.Rand8();
        }
      }

      // Add additional padding to allow detection of over reads/writes when
      // the transform width is equal to MAX_TX_SIZE.
      const int dst_stride = MAX_TX_SIZE + 16;
      std::vector<Pixel> dst_ref(dst_stride * bh_);
      std::vector<Pixel> dst_tst(dst_stride * bh_);

      for (int r = 0; r < bh_; ++r) {
        ASAN_POISON_MEMORY_REGION(&dst_ref[r * dst_stride + bw_],
                                  (dst_stride - bw_) * sizeof(Pixel));
        ASAN_POISON_MEMORY_REGION(&dst_tst[r * dst_stride + bw_],
                                  (dst_stride - bw_) * sizeof(Pixel));
      }

      Predict(speedtest, tx, above, left, dst_ref.data(), dst_tst.data(),
              dst_stride);

      for (int r = 0; r < bh_; ++r) {
        ASAN_UNPOISON_MEMORY_REGION(&dst_ref[r * dst_stride + bw_],
                                    (dst_stride - bw_) * sizeof(Pixel));
        ASAN_UNPOISON_MEMORY_REGION(&dst_tst[r * dst_stride + bw_],
                                    (dst_stride - bw_) * sizeof(Pixel));
      }

      for (int r = 0; r < bh_; ++r) {
        for (int c = 0; c < bw_; ++c) {
          ASSERT_EQ(dst_ref[r * dst_stride + c], dst_tst[r * dst_stride + c])
              << bw_ << "x" << bh_ << " r: " << r << " c: " << c
              << " dx: " << dx_ << " dy: " << dy_
              << " upsample_above: " << upsample_above_
              << " upsample_left: " << upsample_left_;
        }
      }
    }
  }